

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pass2.cpp
# Opt level: O2

string * __thiscall
cs222::Pass2::run(string *__return_storage_ptr__,Pass2 *this,string *srcFileName)

{
  _Alloc_hider __p;
  bool bVar1;
  undefined8 uVar2;
  size_t __val;
  Pass2 *this_00;
  string instObjCode;
  unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_> instruction;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  undefined8 local_7a0;
  bitset<6UL> local_798;
  string line;
  string buffer;
  string progName;
  string local_730;
  string local_710;
  size_t iAddress;
  IntermediateParser iParser;
  string progLength;
  stringstream lineStream;
  ifstream ifs;
  Instruction local_170;
  
  std::__cxx11::string::_M_assign((string *)&this->srcFileName);
  readSymbols(this);
  this_00 = (Pass2 *)&lineStream;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 srcFileName,".listing");
  std::ifstream::ifstream(&ifs,(string *)this_00,_S_in);
  std::__cxx11::string::~string((string *)&lineStream);
  parseProgramName_abi_cxx11_(&progName,this_00,&ifs);
  std::operator+(&progLength,"Program name is \'",&progName);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lineStream,
                 &progLength,"\'");
  logDebug((string *)&lineStream);
  std::__cxx11::string::~string((string *)&lineStream);
  std::__cxx11::string::~string((string *)&progLength);
  IntermediateParser::IntermediateParser(&iParser,(istream *)&ifs);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::istream::seekg(&ifs,0,0);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&ifs,(string *)&line);
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&ifs,(string *)&line);
  uVar2 = std::istream::tellg();
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&ifs,(string *)&line);
  std::__cxx11::stringstream::stringstream((stringstream *)&lineStream,(string *)&line,_S_out|_S_in)
  ;
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  std::operator>>((istream *)&lineStream,(string *)&buffer);
  std::operator>>((istream *)&lineStream,(string *)&buffer);
  while (*buffer._M_dataplus._M_p == '.') {
    uVar2 = std::istream::tellg();
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&ifs,(string *)&line);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)&progLength,(string *)&line,_S_out|_S_in);
    std::__cxx11::stringstream::operator=((stringstream *)&lineStream,(stringstream *)&progLength);
    std::__cxx11::stringstream::~stringstream((stringstream *)&progLength);
    std::operator>>((istream *)&lineStream,(string *)&buffer);
    std::operator>>((istream *)&lineStream,(string *)&buffer);
  }
  std::istream::seekg(&ifs,uVar2,0);
  IntermediateParser::next((IntermediateParser *)&instruction);
  local_798.super__Base_bitset<1UL>._M_w = (_Base_bitset<1UL>)&this->objectCode;
  local_7a0 = &this->correspondingAddresses;
  while ((__uniq_ptr_impl<cs222::Instruction,_std::default_delete<cs222::Instruction>_>)
         instruction._M_t.
         super___uniq_ptr_impl<cs222::Instruction,_std::default_delete<cs222::Instruction>_>._M_t.
         super__Tuple_impl<0UL,_cs222::Instruction_*,_std::default_delete<cs222::Instruction>_>.
         super__Head_base<0UL,_cs222::Instruction_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<cs222::Instruction,_std::default_delete<cs222::Instruction>_>)0x0) {
    Instruction::Instruction
              ((Instruction *)&progLength,
               (Instruction *)
               instruction._M_t.
               super___uniq_ptr_impl<cs222::Instruction,_std::default_delete<cs222::Instruction>_>.
               _M_t.
               super__Tuple_impl<0UL,_cs222::Instruction_*,_std::default_delete<cs222::Instruction>_>
               .super__Head_base<0UL,_cs222::Instruction_*,_false>._M_head_impl);
    __val = Instruction::getAddress((Instruction *)&progLength);
    std::__cxx11::to_string(&local_710,__val);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iAddress,
                   "Operands in instruction at ",&local_710);
    std::operator+(&local_7c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iAddress,
                   ": ");
    Instruction::getOperandsToken_abi_cxx11_(&local_730,(Instruction *)&progLength);
    std::operator+(&instObjCode,&local_7c0,&local_730);
    logDebug(&instObjCode);
    std::__cxx11::string::~string((string *)&instObjCode);
    std::__cxx11::string::~string((string *)&local_730);
    std::__cxx11::string::~string((string *)&local_7c0);
    std::__cxx11::string::~string((string *)&iAddress);
    std::__cxx11::string::~string((string *)&local_710);
    iAddress = Instruction::getAddress((Instruction *)&progLength);
    Instruction::getOperation_abi_cxx11_(&local_7c0,(Instruction *)&progLength);
    std::operator+(&instObjCode,"Operation: ",&local_7c0);
    logDebug(&instObjCode);
    std::__cxx11::string::~string((string *)&instObjCode);
    std::__cxx11::string::~string((string *)&local_7c0);
    Instruction::getOperandsToken_abi_cxx11_(&local_7c0,(Instruction *)&progLength);
    std::operator+(&instObjCode,"Operands: ",&local_7c0);
    logDebug(&instObjCode);
    std::__cxx11::string::~string((string *)&instObjCode);
    std::__cxx11::string::~string((string *)&local_7c0);
    Instruction::Instruction(&local_170,(Instruction *)&progLength);
    translate_abi_cxx11_(&instObjCode,this,&local_170);
    Instruction::~Instruction(&local_170);
    std::operator+(&local_7c0,"Object Code: ",&instObjCode);
    logDebug(&local_7c0);
    std::__cxx11::string::~string((string *)&local_7c0);
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_798.super__Base_bitset<1UL>._M_w,&instObjCode);
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_7a0,
               (value_type_conflict1 *)&iAddress);
    local_7c0._M_dataplus._M_p = local_7c0._M_dataplus._M_p & 0xffffffff00000000;
    bVar1 = Instruction::isSet((Instruction *)&progLength,(Flag *)&local_7c0);
    if (bVar1) {
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&this->modificationAddresses,(value_type_conflict1 *)&iAddress);
    }
    IntermediateParser::next((IntermediateParser *)&local_7c0);
    __p._M_p = local_7c0._M_dataplus._M_p;
    local_7c0._M_dataplus._M_p = (pointer)0x0;
    std::__uniq_ptr_impl<cs222::Instruction,_std::default_delete<cs222::Instruction>_>::reset
              ((__uniq_ptr_impl<cs222::Instruction,_std::default_delete<cs222::Instruction>_> *)
               &instruction,(pointer)__p._M_p);
    std::unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_>::~unique_ptr
              ((unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_> *)
               &local_7c0);
    std::__cxx11::string::~string((string *)&instObjCode);
    Instruction::~Instruction((Instruction *)&progLength);
  }
  parseProgramLength_abi_cxx11_(&progLength,(Pass2 *)0x0,&ifs);
  std::operator+(&local_7c0,"Program is ",&progLength);
  std::operator+(&instObjCode,&local_7c0," bytes long");
  logDebug(&instObjCode);
  std::__cxx11::string::~string((string *)&instObjCode);
  std::__cxx11::string::~string((string *)&local_7c0);
  bVar1 = std::operator==(&this->errorReportMessage,"");
  if (bVar1) {
    std::__cxx11::string::string
              ((string *)&instObjCode,"Dumping Modification Addresses",(allocator *)&local_7c0);
    logDebug(&instObjCode);
    std::__cxx11::string::~string((string *)&instObjCode);
    dumpDeque(&this->modificationAddresses);
    std::__cxx11::string::string
              ((string *)&instObjCode,"Dumping Object Codes",(allocator *)&local_7c0);
    logDebug(&instObjCode);
    std::__cxx11::string::~string((string *)&instObjCode);
    dumpDeque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_798.super__Base_bitset<1UL>._M_w);
    std::__cxx11::string::string
              ((string *)&instObjCode,"Dumping Corresponding Addressses",(allocator *)&local_7c0);
    logDebug(&instObjCode);
    std::__cxx11::string::~string((string *)&instObjCode);
    dumpDeque((deque<unsigned_long,_std::allocator<unsigned_long>_> *)local_7a0);
    writeObjectProgram(this,&progName,&progLength);
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"Pass 2 finished successfully",
               (allocator *)&instObjCode);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)&this->errorReportMessage);
  }
  std::__cxx11::string::~string((string *)&progLength);
  std::unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_>::~unique_ptr
            (&instruction);
  std::__cxx11::string::~string((string *)&buffer);
  std::__cxx11::stringstream::~stringstream((stringstream *)&lineStream);
  std::__cxx11::string::~string((string *)&line);
  Parser::~Parser(&iParser.super_Parser);
  std::__cxx11::string::~string((string *)&progName);
  std::ifstream::~ifstream(&ifs);
  return __return_storage_ptr__;
}

Assistant:

std::string Pass2::run(std::string srcFileName) {
        Pass2::srcFileName = srcFileName;

        readSymbols();

        std::ifstream ifs(srcFileName + ".listing");

        std::string progName = parseProgramName(ifs);
        logDebug("Program name is '" + progName + "'");

        cs222::IntermediateParser iParser(ifs);

        std::string line;
        ifs.seekg(0);
        getline(ifs, line); // Skip first line (column names).
        getline(ifs, line); // Skip the second line (empty line).
        size_t startInst = ifs.tellg();
        getline(ifs, line);

        // Skip comment lines
        std::stringstream lineStream(line);
        std::string buffer;
        lineStream >> buffer; // Skip line number.
        lineStream >> buffer; // Skip address.
        while (buffer[0] == '.')
        {
            startInst = ifs.tellg();
            getline(ifs, line);
            lineStream = std::stringstream(line);
            lineStream >> buffer; // Skip line number.
            lineStream >> buffer; // Skip address.
        }
        ifs.seekg(startInst);

        std::unique_ptr<cs222::Instruction> instruction = iParser.next();
        while (instruction != nullptr) {
            Instruction i = *instruction;
            logDebug("Operands in instruction at " +
                    std::to_string(i.getAddress()) + ": " +
                    i.getOperandsToken());
            const size_t iAddress = i.getAddress();
            logDebug("Operation: " + i.getOperation());
            logDebug("Operands: " + i.getOperandsToken());
            std::string instObjCode = translate(i);
            logDebug("Object Code: " + instObjCode);
            objectCode.push_back(instObjCode);
            correspondingAddresses.push_back(iAddress);
            if (i.isSet(i.FLAG_EXTENDED)) {
                modificationAddresses.push_back(iAddress);
            }
            instruction = iParser.next();
        }

        std::string progLength = parseProgramLength(ifs);
        logDebug("Program is " + progLength + " bytes long");

        if (errorReportMessage == "") {
            logDebug("Dumping Modification Addresses");
            dumpDeque(modificationAddresses);
            logDebug("Dumping Object Codes");
            dumpDeque(objectCode);
            logDebug("Dumping Corresponding Addressses");
            dumpDeque(correspondingAddresses);
            writeObjectProgram(progName, progLength);
            return "Pass 2 finished successfully";
        } else {
            return errorReportMessage;
        }
    }